

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  void *pvVar1;
  Solution *this;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  long lVar10;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_06;
  initializer_list<ListNode_*> __l_07;
  initializer_list<int> __l_08;
  string strb;
  string strc;
  vector<ListNode_*,_std::allocator<ListNode_*>_> lists;
  vector<int,_std::allocator<int>_> bb;
  vector<int,_std::allocator<int>_> aa;
  vector<int,_std::allocator<int>_> rotateArray;
  string stra;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ss;
  allocator_type local_18e;
  allocator_type local_18d;
  allocator_type local_18c;
  allocator_type local_18b;
  allocator_type local_18a;
  allocator_type local_189;
  long *local_188 [2];
  long local_178 [2];
  long *local_168 [2];
  long local_158 [2];
  pointer local_148;
  vector<ListNode_*,_std::allocator<ListNode_*>_> local_140;
  vector<int,_std::allocator<int>_> local_128;
  vector<int,_std::allocator<int>_> local_110;
  vector<int,_std::allocator<int>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3c0000003c;
  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x3c;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_e0;
  std::vector<int,_std::allocator<int>_>::vector(&local_110,__l,(allocator_type *)local_188);
  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x5a0000000a;
  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 10;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_e0;
  std::vector<int,_std::allocator<int>_>::vector(&local_128,__l_00,(allocator_type *)local_188);
  local_188[0] = (long *)0x200000000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_188;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,__l_01,&local_18e);
  local_168[0] = (long *)0x500000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_168;
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,__l_02,&local_189);
  local_140.super__Vector_base<ListNode_*,_std::allocator<ListNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x400000002;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_140;
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,__l_03,&local_18a);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x600000001;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&local_f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l_04,&local_18b);
  local_68 = 0x400000005;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&local_80,__l_05,&local_18c);
  __l_06._M_len = 5;
  __l_06._M_array = &local_e0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,__l_06,&local_18d);
  lVar10 = 0x78;
  do {
    pvVar1 = *(void **)((long)&local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar10);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_f8.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar10) - (long)pvVar1);
    }
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != 0);
  this = (Solution *)operator_new(1);
  local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"dbbca","");
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"aabcc","");
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"aadbbcbcac","");
  Solution::maximumsSplicedArray(this,&local_110,&local_128);
  piVar2 = (pointer)operator_new(0x10);
  *piVar2 = 1;
  piVar2[2] = 0;
  piVar2[3] = 0;
  piVar3 = (pointer)operator_new(0x10);
  *piVar3 = 1;
  piVar3[2] = 0;
  piVar3[3] = 0;
  piVar4 = (pointer)operator_new(0x10);
  *piVar4 = 2;
  piVar4[2] = 0;
  piVar4[3] = 0;
  puVar5 = (undefined4 *)operator_new(0x10);
  *puVar5 = 3;
  *(undefined8 *)(puVar5 + 2) = 0;
  puVar6 = (undefined4 *)operator_new(0x10);
  *puVar6 = 4;
  *(undefined8 *)(puVar6 + 2) = 0;
  local_148 = piVar2;
  puVar7 = (undefined4 *)operator_new(0x10);
  *puVar7 = 4;
  *(undefined8 *)(puVar7 + 2) = 0;
  puVar8 = (undefined4 *)operator_new(0x10);
  *puVar8 = 5;
  *(undefined8 *)(puVar8 + 2) = 0;
  puVar9 = (undefined4 *)operator_new(0x10);
  *puVar9 = 6;
  *(undefined8 *)(puVar9 + 2) = 0;
  *(undefined4 **)(local_148 + 2) = puVar6;
  *(undefined4 **)(puVar6 + 2) = puVar8;
  *(undefined4 **)(piVar3 + 2) = puVar5;
  *(undefined4 **)(puVar5 + 2) = puVar7;
  *(undefined4 **)(piVar4 + 2) = puVar9;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       local_148;
  __l_07._M_len = 3;
  __l_07._M_array = (iterator)&local_f8;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       piVar3;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piVar4;
  std::vector<ListNode_*,_std::allocator<ListNode_*>_>::vector
            (&local_140,__l_07,(allocator_type *)&local_68);
  local_68 = 1;
  uStack_60 = 0x100000001;
  local_58 = 1;
  __l_08._M_len = 5;
  __l_08._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&local_f8,__l_08,&local_18e);
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_140.super__Vector_base<ListNode_*,_std::allocator<ListNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.super__Vector_base<ListNode_*,_std::allocator<ListNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.super__Vector_base<ListNode_*,_std::allocator<ListNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.super__Vector_base<ListNode_*,_std::allocator<ListNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168[0] != local_158) {
    operator_delete(local_168[0],local_158[0] + 1);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  if ((pointer *)
      local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    vector<int> aa = {60,60,60};
    vector<int> bb = {10,90,10};
//    vector<vector<int>> ss = {{0,1}, {0,2}, {1,2}};
    vector<vector<int>> ss = {{0, 2},
                              {0, 5},
                              {2, 4},
                              {1, 6},
                              {5, 4}};
    auto *a = new Solution();
    string stra = "dbbca";
    string strb = "aabcc";
    string strc = "aadbbcbcac";
    a->maximumsSplicedArray(aa, bb);

    ListNode *one = new ListNode(1);
    ListNode *one1 = new ListNode(1);
    ListNode *two = new ListNode(2);
    ListNode *three = new ListNode(3);
    ListNode *four = new ListNode(4);
    ListNode *four1 = new ListNode(4);
    ListNode *five = new ListNode(5);
    ListNode *six = new ListNode(6);
    ListNode *seven = new ListNode(7);

    one->next = four;
    four->next = five;
    one1->next = three;
    three->next = four1;
    two->next = six;
    vector<ListNode *> lists = {one, one1, two};

    vector<int> rotateArray = {1, 0, 1, 1, 1};

}